

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_gettable(lua_State *L,int idx)

{
  long lVar1;
  TValue *t;
  TValue *slot;
  TValue *val;
  
  t = index2value(L,idx);
  if (t->tt_ == 'E') {
    slot = luaH_get((Table *)(t->value_).gc,(TValue *)((L->top).offset + -0x10));
    if ((slot->tt_ & 0xf) != 0) {
      lVar1 = (L->top).offset;
      *(Value *)(lVar1 + -0x10) = slot->value_;
      *(lu_byte *)(lVar1 + -8) = slot->tt_;
      goto LAB_0013c1cc;
    }
  }
  else {
    slot = (TValue *)0x0;
  }
  val = (TValue *)((L->top).offset + -0x10);
  luaV_finishget(L,t,val,(StkId)val,slot);
LAB_0013c1cc:
  return *(byte *)((L->top).offset + -8) & 0xf;
}

Assistant:

LUA_API int lua_gettable (lua_State *L, int idx) {
  const TValue *slot;
  TValue *t;
  lua_lock(L);
  t = index2value(L, idx);
  if (luaV_fastget(L, t, s2v(L->top.p - 1), slot, luaH_get)) {
    setobj2s(L, L->top.p - 1, slot);
  }
  else
    luaV_finishget(L, t, s2v(L->top.p - 1), L->top.p - 1, slot);
  lua_unlock(L);
  return ttype(s2v(L->top.p - 1));
}